

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O3

xml_node<char> * __thiscall
rapidxml::xml_document<char>::parse_element<0>(xml_document<char> *this,char **text)

{
  byte *pbVar1;
  long lVar2;
  xml_node<char> *node;
  char *pcVar3;
  undefined8 *puVar4;
  size_t sVar5;
  char *pcVar6;
  
  node = (xml_node<char> *)memory_pool<char>::allocate_aligned(&this->super_memory_pool<char>,0x60);
  (node->super_xml_base<char>).m_parent = (xml_node<char> *)0x0;
  (node->super_xml_base<char>).m_name = (char *)0x0;
  (node->super_xml_base<char>).m_value = (char *)0x0;
  node->m_type = node_element;
  node->m_first_node = (xml_node<char> *)0x0;
  node->m_first_attribute = (xml_attribute<char> *)0x0;
  pcVar3 = *text;
  sVar5 = 0xffffffffffffffff;
  do {
    lVar2 = sVar5 + 1;
    sVar5 = sVar5 + 1;
  } while (internal::lookup_tables<0>::lookup_node_name[(byte)pcVar3[lVar2]] != '\0');
  *text = pcVar3 + sVar5;
  if (sVar5 == 0) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x18);
    pcVar3 = *text;
    *puVar4 = &PTR__exception_00215908;
    pcVar6 = "expected element name";
  }
  else {
    (node->super_xml_base<char>).m_name = pcVar3;
    (node->super_xml_base<char>).m_name_size = sVar5;
    pcVar3 = *text + -1;
    do {
      pbVar1 = (byte *)(pcVar3 + 1);
      pcVar3 = pcVar3 + 1;
    } while (internal::lookup_tables<0>::lookup_whitespace[*pbVar1] != '\0');
    *text = pcVar3;
    parse_node_attributes<0>(this,text,node);
    pcVar3 = *text;
    if (*pcVar3 == '/') {
      *text = pcVar3 + 1;
      if (pcVar3[1] == '>') {
        *text = pcVar3 + 2;
        goto LAB_0015dcc0;
      }
    }
    else if (*pcVar3 == '>') {
      *text = pcVar3 + 1;
      parse_node_contents<0>(this,text,node);
LAB_0015dcc0:
      pcVar3 = (node->super_xml_base<char>).m_name;
      if (pcVar3 == (char *)0x0) {
        pcVar3 = &xml_base<char>::nullstr()::zero;
        sVar5 = 0;
      }
      else {
        sVar5 = (node->super_xml_base<char>).m_name_size;
      }
      pcVar3[sVar5] = '\0';
      return node;
    }
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x18);
    pcVar3 = *text;
    *puVar4 = &PTR__exception_00215908;
    pcVar6 = "expected >";
  }
  puVar4[1] = pcVar6;
  puVar4[2] = pcVar3;
  __cxa_throw(puVar4,&parse_error::typeinfo,std::exception::~exception);
}

Assistant:

xml_node<Ch> *parse_element(Ch *&text)
        {
            // Create element node
            xml_node<Ch> *element = this->allocate_node(node_element);

            // Extract element name
            Ch *name = text;
            skip<node_name_pred, Flags>(text);
            if (text == name)
                RAPIDXML_PARSE_ERROR("expected element name", text);
            element->name(name, text - name);
            
            // Skip whitespace between element name and attributes or >
            skip<whitespace_pred, Flags>(text);

            // Parse attributes, if any
            parse_node_attributes<Flags>(text, element);

            // Determine ending type
            if (*text == Ch('>'))
            {
                ++text;
                parse_node_contents<Flags>(text, element);
            }
            else if (*text == Ch('/'))
            {
                ++text;
                if (*text != Ch('>'))
                    RAPIDXML_PARSE_ERROR("expected >", text);
                ++text;
            }
            else
                RAPIDXML_PARSE_ERROR("expected >", text);

            // Place zero terminator after name
            if (!(Flags & parse_no_string_terminators))
                element->name()[element->name_size()] = Ch('\0');

            // Return parsed element
            return element;
        }